

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateSectionFrame
          (ChElementShellANCF_3423 *this,double u,double v,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar12;
  undefined1 auVar21 [16];
  double dVar13;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  undefined1 auVar50 [16];
  ChVector<double> MidsurfaceY;
  ChVector<double> MidsurfaceX;
  MatrixNx3 e_bar;
  ChVector<double> local_200;
  ChMatrixNM<double,_8,_3> *local_1e8;
  undefined1 *local_1e0;
  ChVector<double> local_1d8;
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  ChMatrixNM<double,_8,_3> local_140;
  
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x18])();
  CalcCoordMatrix(this,&local_140);
  local_200.m_data[1] = (double)local_180;
  auVar41._8_8_ = 0x3fd0000000000000;
  auVar41._0_8_ = 0x3fd0000000000000;
  auVar41._16_8_ = 0x3fd0000000000000;
  auVar41._24_8_ = 0x3fd0000000000000;
  auVar11 = vpermi2pd_avx512f(_DAT_009aafc0,ZEXT864((ulong)(1.0 - v)),
                              ZEXT1664(CONCAT88(v + 1.0,v + 1.0)));
  auVar6._8_8_ = this->m_lenX;
  auVar6._0_8_ = this->m_lenX;
  auVar6 = vdivpd_avx512vl(_DAT_009aa830,auVar6);
  auVar7._8_8_ = this->m_lenY;
  auVar7._0_8_ = this->m_lenY;
  auVar7 = vdivpd_avx512vl(_DAT_009aa830,auVar7);
  dVar32 = this->m_thickness * 0.0 * 0.5 * 0.25;
  auVar22 = vpermpd_avx2(ZEXT1632(CONCAT88(dVar32,dVar32)),0x55);
  auVar1 = vpermpd_avx2(ZEXT1632(auVar6),0x50);
  auVar22 = vunpckhpd_avx(auVar41,auVar22);
  auVar23 = ZEXT3264(CONCAT824(auVar1._24_8_ * auVar22._24_8_,
                               CONCAT816(auVar1._16_8_ * auVar22._16_8_,
                                         CONCAT88(auVar1._8_8_ * auVar22._8_8_,
                                                  auVar1._0_8_ * auVar22._0_8_))));
  auVar23 = vshuff64x2_avx512f(auVar23,auVar23,0x14);
  local_180 = vmulpd_avx512f(auVar11,auVar23);
  auVar38 = ZEXT1632(CONCAT88(dVar32,1.0 - u));
  auVar22 = vpermpd_avx2(auVar38,0x60);
  auVar1 = vunpckhpd_avx(auVar41,auVar22);
  dVar32 = u + 1.0;
  auVar11 = vpermpd_avx512f(_DAT_009ab000,ZEXT1664(auVar7));
  auVar22._8_8_ = dVar32;
  auVar22._0_8_ = dVar32;
  auVar22._16_8_ = dVar32;
  auVar22._24_8_ = dVar32;
  auVar22 = vblendpd_avx(auVar38,auVar22,0xc);
  auVar23 = ZEXT3264(CONCAT824(auVar22._24_8_ * auVar1._24_8_,
                               CONCAT816(auVar22._16_8_ * auVar1._16_8_,
                                         CONCAT88(auVar22._8_8_ * auVar1._8_8_,
                                                  auVar22._0_8_ * auVar1._0_8_))));
  auVar23 = vshuff64x2_avx512f(auVar23,auVar23,0x14);
  local_1c0 = vmulpd_avx512f(auVar23,auVar11);
  local_200.m_data[0] = (double)&local_140;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (&local_1d8,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_200,(type *)0x0);
  local_1e8 = &local_140;
  local_1e0 = local_1c0;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (&local_200,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_1e8,(type *)0x0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_1d8.m_data[0];
  auVar10 = ZEXT816(0x3ff0000000000000);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_1d8.m_data[2];
  auVar9 = ZEXT816(0) << 0x40;
  if ((((local_1d8.m_data[0] != 0.0) || (NAN(local_1d8.m_data[0]))) || (local_1d8.m_data[1] != 0.0))
     || (NAN(local_1d8.m_data[1]))) {
LAB_007357c2:
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_1d8.m_data[1] * local_1d8.m_data[1];
    auVar6 = vfmadd231sd_fma(auVar34,auVar14,auVar14);
    auVar6 = vfmadd231sd_fma(auVar6,auVar29,auVar29);
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar32 = 1.0 / auVar6._0_8_;
    bVar5 = 2.2250738585072014e-308 <= auVar6._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)bVar5 * (long)(local_1d8.m_data[2] * dVar32);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (ulong)bVar5 * (long)(local_1d8.m_data[1] * dVar32);
    auVar10._0_8_ =
         (ulong)bVar5 * (long)(local_1d8.m_data[0] * dVar32) + (ulong)!bVar5 * 0x3ff0000000000000;
    auVar10._8_8_ = 0;
  }
  else {
    auVar8 = ZEXT816(0) << 0x40;
    if ((local_1d8.m_data[2] != 0.0) || (NAN(local_1d8.m_data[2]))) goto LAB_007357c2;
  }
  dVar46 = auVar9._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_200.m_data[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_200.m_data[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_200.m_data[1];
  dVar48 = auVar10._0_8_;
  dVar47 = auVar8._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar48 * local_200.m_data[2];
  auVar6 = vfmsub231sd_fma(auVar30,auVar8,auVar39);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar47 * local_200.m_data[1];
  auVar7 = vfmsub231sd_fma(auVar25,auVar9,auVar35);
  dVar32 = auVar7._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar46 * local_200.m_data[0];
  auVar14 = vfmsub231sd_fma(auVar15,auVar10,auVar37);
  dVar12 = auVar14._0_8_;
  dVar28 = auVar6._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar28 * dVar28;
  auVar6 = vfmadd231sd_fma(auVar43,auVar7,auVar7);
  auVar6 = vfmadd231sd_fma(auVar6,auVar14,auVar14);
  auVar6 = vsqrtsd_avx(auVar6,auVar6);
  dVar33 = auVar6._0_8_;
  if (dVar33 < 0.0001) {
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar6 = vandpd_avx512vl(auVar39,auVar2);
    if (0.9 <= auVar6._0_8_) {
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar6 = vandpd_avx512vl(auVar37,auVar3);
      if (0.9 <= auVar6._0_8_) {
        auVar4._8_8_ = 0x7fffffffffffffff;
        auVar4._0_8_ = 0x7fffffffffffffff;
        auVar6 = vandpd_avx512vl(auVar35,auVar4);
        auVar7 = ZEXT816(0);
        if (0.9 <= auVar6._0_8_) goto LAB_007358d8;
        auVar6 = ZEXT816(0x3ff0000000000000);
      }
      else {
        auVar7 = ZEXT816(0x3ff0000000000000);
LAB_007358d8:
        auVar6 = ZEXT816(0);
      }
      auVar14 = ZEXT816(0);
    }
    else {
      auVar14 = ZEXT816(0x3ff0000000000000);
      auVar6 = ZEXT816(0);
      auVar7 = ZEXT816(0);
    }
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar6._0_8_ * -dVar48;
    auVar29 = vfmadd231sd_fma(auVar31,auVar8,auVar14);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar7._0_8_ * -dVar47;
    auVar6 = vfmadd231sd_fma(auVar26,auVar9,auVar6);
    dVar32 = auVar6._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar14._0_8_ * -dVar46;
    auVar7 = vfmadd231sd_fma(auVar16,auVar10,auVar7);
    dVar12 = auVar7._0_8_;
    dVar28 = auVar29._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar28 * dVar28;
    auVar6 = vfmadd231sd_fma(auVar36,auVar6,auVar6);
    auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar7);
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar33 = auVar6._0_8_;
  }
  dVar33 = 1.0 / dVar33;
  dVar32 = dVar32 * dVar33;
  dVar12 = dVar12 * dVar33;
  dVar28 = dVar28 * dVar33;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar12;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar47 * dVar32;
  auVar6 = vfmsub231sd_fma(auVar27,auVar17,auVar10);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar46 * dVar12;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar28;
  auVar7 = vfmsub231sd_fma(auVar44,auVar45,auVar8);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar32;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar48 * dVar28;
  auVar9 = vfmsub231sd_fma(auVar50,auVar40,auVar9);
  dVar24 = auVar6._0_8_;
  dVar33 = dVar12 + dVar48 + dVar24;
  dVar42 = auVar7._0_8_;
  dVar49 = auVar9._0_8_;
  if (0.0 <= dVar33) {
    dVar33 = dVar33 + 1.0;
    if (dVar33 < 0.0) {
      dVar12 = sqrt(dVar33);
    }
    else {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar33;
      auVar6 = vsqrtsd_avx(auVar19,auVar19);
      dVar12 = auVar6._0_8_;
    }
    dVar24 = dVar12 * 0.5;
    dVar12 = 0.5 / dVar12;
    dVar33 = (dVar49 - dVar28) * dVar12;
    dVar48 = (dVar32 - dVar47) * dVar12;
    dVar12 = (dVar46 - dVar42) * dVar12;
    goto LAB_00735bc7;
  }
  if (dVar24 <= dVar48) {
    if (dVar48 < dVar12) goto LAB_007359a6;
    dVar12 = ((dVar48 - dVar24) - dVar12) + 1.0;
    if (dVar12 < 0.0) {
      dVar13 = sqrt(dVar12);
    }
    else {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar12;
      auVar6 = vsqrtsd_avx(auVar21,auVar21);
      dVar13 = auVar6._0_8_;
    }
    dVar24 = dVar49 - dVar28;
    dVar33 = dVar13 * 0.5;
    dVar13 = 0.5 / dVar13;
    dVar48 = (dVar46 + dVar42) * dVar13;
    dVar12 = (dVar47 + dVar32) * dVar13;
  }
  else if (dVar24 < dVar12) {
LAB_007359a6:
    dVar12 = ((dVar12 - dVar48) - dVar24) + 1.0;
    if (dVar12 < 0.0) {
      dVar13 = sqrt(dVar12);
    }
    else {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar12;
      auVar6 = vsqrtsd_avx(auVar20,auVar20);
      dVar13 = auVar6._0_8_;
    }
    dVar24 = dVar46 - dVar42;
    dVar12 = dVar13 * 0.5;
    dVar13 = 0.5 / dVar13;
    dVar33 = (dVar47 + dVar32) * dVar13;
    dVar48 = (dVar49 + dVar28) * dVar13;
  }
  else {
    dVar12 = ((dVar24 - dVar12) - dVar48) + 1.0;
    if (dVar12 < 0.0) {
      dVar13 = sqrt(dVar12);
    }
    else {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar12;
      auVar6 = vsqrtsd_avx(auVar18,auVar18);
      dVar13 = auVar6._0_8_;
    }
    dVar24 = dVar32 - dVar47;
    dVar48 = dVar13 * 0.5;
    dVar13 = 0.5 / dVar13;
    dVar12 = (dVar49 + dVar28) * dVar13;
    dVar33 = (dVar46 + dVar42) * dVar13;
  }
  dVar24 = dVar24 * dVar13;
LAB_00735bc7:
  rot->m_data[0] = dVar24;
  rot->m_data[1] = dVar33;
  rot->m_data[2] = dVar48;
  rot->m_data[3] = dVar12;
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateSectionFrame(const double u,
                                                   const double v,
                                                   ChVector<>& point,
                                                   ChQuaternion<>& rot) {
    // this is not a corotational element, so just do:
    EvaluateSectionPoint(u, v, point);

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, u, v, 0);
    ShapeFunctionsDerivativeY(Ny, u, v, 0);

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> MidsurfaceX = e_bar.transpose() * Nx.transpose();
    ChVector<double> MidsurfaceY = e_bar.transpose() * Ny.transpose();

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the shell xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the shell eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(MidsurfaceX, MidsurfaceY);

    rot = msect.Get_A_quaternion();
}